

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_posix.cc
# Opt level: O0

Status __thiscall
leveldb::anon_unknown_1::PosixMmapReadableFile::Read
          (PosixMmapReadableFile *this,uint64_t offset,size_t n,Slice *result,char *scratch)

{
  size_t in_RCX;
  string *in_RDX;
  long in_RSI;
  char *in_RDI;
  undefined8 *in_R8;
  Slice local_50;
  Slice local_40;
  undefined8 *local_28;
  
  local_28 = in_R8;
  if (*(undefined1 **)(in_RSI + 0x10) < &in_RDX->_M_dataplus + in_RCX) {
    Slice::Slice(&local_40);
    *local_28 = local_40.data_;
    local_28[1] = local_40.size_;
    PosixError(in_RDX,(int)(in_RCX >> 0x20));
  }
  else {
    Slice::Slice(&local_50,(char *)(&in_RDX->_M_dataplus + *(long *)(in_RSI + 8)),in_RCX);
    *local_28 = local_50.data_;
    local_28[1] = local_50.size_;
    Status::OK();
  }
  return (Status)in_RDI;
}

Assistant:

Status Read(uint64_t offset, size_t n, Slice* result,
              char* scratch) const override {
    if (offset + n > length_) {
      *result = Slice();
      return PosixError(filename_, EINVAL);
    }

    *result = Slice(mmap_base_ + offset, n);
    return Status::OK();
  }